

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O1

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<QList<QString>>>
          (QtPrivate *this,QDebug debug,char *which,QList<QList<QString>_> *c)

{
  QList<QString> *pQVar1;
  char *pcVar2;
  QTextStream *pQVar3;
  long lVar4;
  undefined8 uVar5;
  Stream *__old_val;
  storage_type *psVar6;
  storage_type *psVar7;
  QList<QString> *c_00;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QDebugStateSaver saver;
  QDebug local_78;
  QtPrivate local_70 [8];
  QDebug local_68;
  QtPrivate local_60 [8];
  undefined1 *local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)debug.stream);
  pQVar3 = *(QTextStream **)debug.stream;
  pQVar3[0x30] = (QTextStream)0x0;
  if (which == (char *)0x0) {
    psVar7 = (storage_type *)0x0;
  }
  else {
    psVar6 = (storage_type *)0xffffffffffffffff;
    do {
      psVar7 = psVar6 + 1;
      pcVar2 = which + 1 + (long)psVar6;
      psVar6 = psVar7;
    } while (*pcVar2 != '\0');
  }
  QVar8.m_data = psVar7;
  QVar8.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar8);
  QTextStream::operator<<(pQVar3,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  QTextStream::operator<<(*(QTextStream **)debug.stream,'(');
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  c_00 = (c->d).ptr;
  lVar4 = (c->d).size;
  pQVar1 = c_00 + lVar4;
  if (lVar4 != 0) {
    local_50.d.d = *(Data **)debug.stream;
    *(int *)&(&(local_50.d.d)->super_QArrayData)[2].alloc =
         (int)(&(local_50.d.d)->super_QArrayData)[2].alloc + 1;
    local_68.stream = (Stream *)0x0;
    printSequentialContainer<QList<QString>>(local_60,(Stream *)&local_50,"QList",c_00);
    QDebug::~QDebug((QDebug *)&local_50);
    QDebug::~QDebug((QDebug *)local_60);
    QDebug::~QDebug(&local_68);
    c_00 = c_00 + 1;
  }
  if (c_00 != pQVar1) {
    do {
      pQVar3 = *(QTextStream **)debug.stream;
      QVar9.m_data = (storage_type *)0x2;
      QVar9.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar9);
      QTextStream::operator<<(pQVar3,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
      }
      local_50.d.d = *(Data **)debug.stream;
      *(int *)&(&(local_50.d.d)->super_QArrayData)[2].alloc =
           (int)(&(local_50.d.d)->super_QArrayData)[2].alloc + 1;
      local_78.stream = (Stream *)0x0;
      printSequentialContainer<QList<QString>>(local_70,(Stream *)&local_50,"QList",c_00);
      QDebug::~QDebug((QDebug *)&local_50);
      QDebug::~QDebug((QDebug *)local_70);
      QDebug::~QDebug(&local_78);
      c_00 = c_00 + 1;
    } while (c_00 != pQVar1);
  }
  QTextStream::operator<<(*(QTextStream **)debug.stream,')');
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  uVar5 = *(undefined8 *)debug.stream;
  *(undefined8 *)debug.stream = 0;
  *(undefined8 *)this = uVar5;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)(Stream *)this;
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}